

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

Stack<rapidjson::CrtAllocator> * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::operator=
          (Stack<rapidjson::CrtAllocator> *this,Stack<rapidjson::CrtAllocator> *rhs)

{
  Stack<rapidjson::CrtAllocator> *rhs_local;
  Stack<rapidjson::CrtAllocator> *this_local;
  
  if (rhs != this) {
    Destroy(this);
    this->allocator_ = rhs->allocator_;
    this->ownAllocator_ = rhs->ownAllocator_;
    this->stack_ = rhs->stack_;
    this->stackTop_ = rhs->stackTop_;
    this->stackEnd_ = rhs->stackEnd_;
    this->initialCapacity_ = rhs->initialCapacity_;
    rhs->allocator_ = (CrtAllocator *)0x0;
    rhs->ownAllocator_ = (CrtAllocator *)0x0;
    rhs->stack_ = (char *)0x0;
    rhs->stackTop_ = (char *)0x0;
    rhs->stackEnd_ = (char *)0x0;
    rhs->initialCapacity_ = 0;
  }
  return this;
}

Assistant:

Stack& operator=(Stack&& rhs) {
        if (&rhs != this)
        {
            Destroy();

            allocator_ = rhs.allocator_;
            ownAllocator_ = rhs.ownAllocator_;
            stack_ = rhs.stack_;
            stackTop_ = rhs.stackTop_;
            stackEnd_ = rhs.stackEnd_;
            initialCapacity_ = rhs.initialCapacity_;

            rhs.allocator_ = 0;
            rhs.ownAllocator_ = 0;
            rhs.stack_ = 0;
            rhs.stackTop_ = 0;
            rhs.stackEnd_ = 0;
            rhs.initialCapacity_ = 0;
        }
        return *this;
    }